

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlStrcmp(xmlChar *str1,xmlChar *str2)

{
  byte bVar1;
  byte *pbStack_20;
  int tmp;
  xmlChar *str2_local;
  xmlChar *str1_local;
  
  if (str1 == str2) {
    str1_local._4_4_ = 0;
  }
  else if (str1 == (xmlChar *)0x0) {
    str1_local._4_4_ = -1;
  }
  else {
    pbStack_20 = str2;
    str2_local = str1;
    if (str2 == (xmlChar *)0x0) {
      str1_local._4_4_ = 1;
    }
    else {
      do {
        if ((uint)*str2_local - (uint)*pbStack_20 != 0) {
          return (uint)*str2_local - (uint)*pbStack_20;
        }
        bVar1 = *pbStack_20;
        pbStack_20 = pbStack_20 + 1;
        str2_local = str2_local + 1;
      } while (bVar1 != 0);
      str1_local._4_4_ = 0;
    }
  }
  return str1_local._4_4_;
}

Assistant:

int
xmlStrcmp(const xmlChar *str1, const xmlChar *str2) {
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strcmp((const char *)str1, (const char *)str2));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}